

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::anon_unknown_5::TileBuffer::TileBuffer(TileBuffer *this,Compressor *comp)

{
  long in_RSI;
  Array<char> *in_RDI;
  
  Array<char>::Array(in_RDI);
  in_RDI[1]._size = 0;
  *(undefined4 *)&in_RDI[1]._data = 0;
  in_RDI[2]._size = in_RSI;
  TileCoord::TileCoord((TileCoord *)&in_RDI[2]._data,0,0,0,0);
  *(undefined1 *)&in_RDI[3]._data = 0;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  IlmThread_2_5::Semaphore::Semaphore((Semaphore *)(in_RDI + 6),1);
  return;
}

Assistant:

TileBuffer::TileBuffer (Compressor *comp):
    uncompressedData (0),
    buffer (0),
    dataSize (0),
    compressor (comp),
    format (defaultFormat (compressor)),
    dx (-1),
    dy (-1),
    lx (-1),
    ly (-1),
    hasException (false),
    exception (),
    _sem (1)
{
    // empty
}